

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this,size_t newSize)

{
  bool bVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar7;
  UnfinishedValue *pUVar8;
  long lVar9;
  ulong uVar10;
  UnfinishedValue *pUVar11;
  UnfinishedValue *pUVar12;
  UnfinishedValue *pUVar13;
  byte bVar14;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> newBuilder;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> local_48;
  
  bVar14 = 0;
  pUVar11 = (this->builder).ptr;
  pUVar8 = (this->builder).pos;
  uVar10 = ((long)pUVar8 - (long)pUVar11 >> 3) * -0x79435e50d79435e5;
  if ((newSize <= uVar10 && uVar10 - newSize != 0) &&
     (pUVar11 = pUVar11 + newSize, pUVar11 < pUVar8)) {
    do {
      pUVar8 = pUVar8 + -1;
    } while (pUVar11 < pUVar8);
    (this->builder).pos = pUVar8;
  }
  local_48.ptr = (UnfinishedValue *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x98,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = local_48.ptr + newSize;
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pUVar8 = (this->builder).pos;
  local_48.pos = local_48.ptr;
  for (pUVar11 = (this->builder).ptr; pUVar11 != pUVar8; pUVar11 = pUVar11 + 1) {
    pUVar12 = pUVar11;
    pUVar13 = local_48.pos;
    for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pUVar13->source)._reader.segment = (pUVar12->source)._reader.segment;
      pUVar12 = (UnfinishedValue *)((long)pUVar12 + (ulong)bVar14 * -0x10 + 8);
      pUVar13 = (UnfinishedValue *)((long)pUVar13 + (ulong)bVar14 * -0x10 + 8);
    }
    bVar1 = (pUVar11->typeScope).ptr.isSet;
    ((local_48.pos)->typeScope).ptr.isSet = bVar1;
    if (bVar1 == true) {
      ((local_48.pos)->typeScope).ptr.field_1 = (pUVar11->typeScope).ptr.field_1;
      (pUVar11->typeScope).ptr.isSet = false;
    }
    SVar5 = (pUVar11->target)._builder.pointerCount;
    uVar6 = *(undefined2 *)&(pUVar11->target)._builder.field_0x26;
    ((local_48.pos)->target)._builder.dataSize = (pUVar11->target)._builder.dataSize;
    ((local_48.pos)->target)._builder.pointerCount = SVar5;
    *(undefined2 *)&((local_48.pos)->target)._builder.field_0x26 = uVar6;
    pSVar2 = (pUVar11->target)._builder.segment;
    pCVar3 = (pUVar11->target)._builder.capTable;
    pWVar4 = (pUVar11->target)._builder.pointers;
    ((local_48.pos)->target)._builder.data = (pUVar11->target)._builder.data;
    ((local_48.pos)->target)._builder.pointers = pWVar4;
    ((local_48.pos)->target)._builder.segment = pSVar2;
    ((local_48.pos)->target)._builder.capTable = pCVar3;
    local_48.pos = local_48.pos + 1;
  }
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=
            (&this->builder,&local_48);
  pUVar8 = local_48.endPtr;
  pRVar7 = local_48.pos;
  pUVar11 = local_48.ptr;
  if (local_48.ptr != (UnfinishedValue *)0x0) {
    local_48.ptr = (UnfinishedValue *)0x0;
    local_48.pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    local_48.endPtr = (UnfinishedValue *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pUVar11,0x98,
               ((long)pRVar7 - (long)pUVar11 >> 3) * -0x79435e50d79435e5,
               ((long)pUVar8 - (long)pUVar11 >> 3) * -0x79435e50d79435e5,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::UnfinishedValue>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }